

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_reader<wchar_t,_jsoncons::string_source<wchar_t>,_std::allocator<char>_>::
read_next(basic_json_reader<wchar_t,_jsoncons::string_source<wchar_t>,_std::allocator<char>_> *this,
         error_code *ec)

{
  basic_json_parser<wchar_t,_std::allocator<char>_> *this_00;
  parse_state pVar1;
  char_type_conflict *pcVar2;
  value_type_conflict2 *pvVar3;
  value_type_conflict2 *pvVar4;
  value_type_conflict2 *data_1;
  char_type_conflict *pcVar5;
  value_type_conflict2 *data;
  char_type_conflict *pcVar6;
  bool bVar7;
  
  this_00 = &this->parser_;
  basic_json_parser<wchar_t,_std::allocator<char>_>::reset(this_00);
  while ((this->parser_).more_ == true) {
    pcVar5 = (this->parser_).end_input_;
    pcVar6 = (this->parser_).input_ptr_;
    if (pcVar6 == pcVar5) {
      pcVar2 = (this->source_).source_.current_;
      pcVar5 = (this->source_).source_.end_;
      if (pcVar2 == pcVar5) {
        pcVar5 = pcVar6;
        if (ec->_M_value != 0) {
          return;
        }
      }
      else {
        (this->source_).source_.current_ = pcVar5;
        if ((this->source_).bof_ == true) {
          (this->source_).bof_ = false;
        }
        if (ec->_M_value != 0) {
          return;
        }
        (this->parser_).begin_input_ = pcVar2;
        pcVar5 = (char_type_conflict *)(((long)pcVar5 - (long)pcVar2) + (long)pcVar2);
        (this->parser_).end_input_ = pcVar5;
        (this->parser_).input_ptr_ = pcVar2;
        pcVar6 = pcVar2;
      }
    }
    basic_json_parser<wchar_t,_std::allocator<char>_>::parse_some_(this_00,this->visitor_,ec);
    bVar7 = ec->_M_value != 0;
    if (pcVar6 == pcVar5 && !bVar7) {
      pVar1 = (this->parser_).state_;
      if (pVar1 == start) break;
      bVar7 = false;
      if ((pVar1 != accept) && (((this->parser_).done_ & 1U) == 0)) {
        std::error_code::operator=(ec,unexpected_eof);
        return;
      }
    }
    if (bVar7) {
      return;
    }
  }
  basic_json_parser<wchar_t,_std::allocator<char>_>::skip_whitespace(this_00);
  if ((this->source_).source_.current_ == (this->source_).source_.end_) {
    return;
  }
  basic_json_parser<wchar_t,_std::allocator<char>_>::skip_whitespace(this_00);
  if ((this->parser_).input_ptr_ != (this->parser_).end_input_) {
    return;
  }
  pvVar3 = (this->source_).source_.current_;
  pvVar4 = (this->source_).source_.end_;
  if (pvVar3 == pvVar4) {
    return;
  }
  (this->source_).source_.current_ = pvVar4;
  if ((this->source_).bof_ == true) {
    (this->source_).bof_ = false;
  }
  if (ec->_M_value != 0) {
    return;
  }
  (this->parser_).begin_input_ = pvVar3;
  (this->parser_).end_input_ = (char_type_conflict *)(((long)pvVar4 - (long)pvVar3) + (long)pvVar3);
  (this->parser_).input_ptr_ = pvVar3;
  return;
}

Assistant:

void read_next(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }        
            parser_.reset();
            while (!parser_.stopped())
            {
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                bool eof = parser_.source_exhausted();
                parser_.parse_some(visitor_, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                if (eof)
                {
                    if (parser_.enter())
                    {
                        break;
                    }
                    else if (!parser_.accept())
                    {
                        ec = json_errc::unexpected_eof;
                        return;
                    }
                }
            }
            
            parser_.skip_whitespace();
            while (!source_.eof())
            {
                parser_.skip_whitespace();
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                else
                {
                    break;
                }
            }
        }